

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
match_func_to_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  DatatypeMatch DVar4;
  MOJOSHADER_astDataType *pMVar5;
  int local_8c;
  DatatypeMatch compatible;
  int i;
  int score;
  int perfect;
  MOJOSHADER_astDataTypeFunction *dtfn;
  MOJOSHADER_astDataType *dt;
  SymbolScope *item;
  MOJOSHADER_astDataType *pMStack_60;
  int match;
  MOJOSHADER_astArguments *args;
  void *pvStack_50;
  int argcount;
  void *iter;
  void *value;
  char *sym;
  MOJOSHADER_astExpressionIdentifier *ident;
  void *pvStack_28;
  int best_score;
  SymbolScope *best;
  MOJOSHADER_astExpressionCallFunction *ast_local;
  Context_conflict *ctx_local;
  
  pvStack_28 = (void *)0x0;
  ident._4_4_ = DT_MATCH_INCOMPATIBLE;
  sym = (char *)ast->identifier;
  value = ((MOJOSHADER_astExpressionIdentifier *)sym)->identifier;
  iter = (void *)0x0;
  pvStack_50 = (void *)0x0;
  args._4_4_ = 0;
  best = (SymbolScope *)ast;
  ast_local = (MOJOSHADER_astExpressionCallFunction *)ctx;
  for (pMStack_60 = (MOJOSHADER_astDataType *)ast->args; pMStack_60 != (MOJOSHADER_astDataType *)0x0
      ; pMStack_60 = (MOJOSHADER_astDataType *)((MOJOSHADER_astArguments *)pMStack_60)->next) {
    args._4_4_ = args._4_4_ + 1;
    type_check_ast((Context_conflict *)ast_local,
                   *(MOJOSHADER_astExpression **)&(pMStack_60->function).num_params);
  }
  item._4_4_ = 0;
  do {
    do {
      iVar3 = hash_iter((HashTable *)ast_local[1].args,value,&iter,&stack0xffffffffffffffb0);
      pvVar2 = iter;
      if (iVar3 == 0) {
LAB_00147a2a:
        if (1 < item._4_4_) {
          if (pvStack_28 == (void *)0x0) {
            __assert_fail("best != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9ea,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          failf((Context_conflict *)ast_local,"Ambiguous function call to \'%s\'",value);
        }
        if (pvStack_28 == (void *)0x0) {
          if (item._4_4_ != 0) {
            __assert_fail("match == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9f0,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          if (ident._4_4_ != DT_MATCH_INCOMPATIBLE) {
            __assert_fail("best_score == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9f1,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          failf((Context_conflict *)ast_local,"No matching function named \'%s\'",value);
        }
        else {
          pMVar5 = reduce_datatype((Context_conflict *)ast_local,
                                   *(MOJOSHADER_astDataType **)((long)pvStack_28 + 8));
          *(MOJOSHADER_astDataType **)(sym + 0x18) = pMVar5;
          *(undefined4 *)(sym + 0x28) = *(undefined4 *)((long)pvStack_28 + 0x10);
        }
        return *(MOJOSHADER_astDataType **)(sym + 0x18);
      }
      pMVar5 = reduce_datatype((Context_conflict *)ast_local,
                               *(MOJOSHADER_astDataType **)((long)iter + 8));
      if (pMVar5->type != MOJOSHADER_AST_DATATYPE_FUNCTION) {
        return pMVar5;
      }
      compatible = DT_MATCH_INCOMPATIBLE;
      if (args._4_4_ == (pMVar5->function).num_params) {
        pMStack_60 = best[1].datatype;
        for (local_8c = 0; local_8c < args._4_4_; local_8c = local_8c + 1) {
          if (pMStack_60 == (MOJOSHADER_astDataType *)0x0) {
            __assert_fail("args != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9b8,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          piVar1 = &(pMStack_60->function).num_params;
          pMStack_60 = *(MOJOSHADER_astDataType **)(pMStack_60 + 1);
          DVar4 = compatible_arg_datatype
                            ((Context_conflict *)ast_local,
                             *(MOJOSHADER_astDataType **)(*(long *)piVar1 + 0x18),
                             *(MOJOSHADER_astDataType **)((pMVar5->user).name + (long)local_8c * 8))
          ;
          if (DVar4 == DT_MATCH_INCOMPATIBLE) {
            pMStack_60 = (MOJOSHADER_astDataType *)0x0;
            compatible = DT_MATCH_INCOMPATIBLE;
            break;
          }
          compatible = DVar4 + compatible;
        }
        if (pMStack_60 != (MOJOSHADER_astDataType *)0x0) {
          compatible = DT_MATCH_INCOMPATIBLE;
        }
      }
    } while (compatible == DT_MATCH_INCOMPATIBLE);
    if (compatible == args._4_4_ << 2) {
      item._4_4_ = 1;
      pvStack_28 = pvVar2;
      goto LAB_00147a2a;
    }
    if ((int)ident._4_4_ <= (int)compatible) {
      if (compatible == ident._4_4_) {
        item._4_4_ = item._4_4_ + 1;
      }
      else if ((int)ident._4_4_ < (int)compatible) {
        item._4_4_ = 1;
        pvStack_28 = pvVar2;
        ident._4_4_ = compatible;
      }
    }
  } while( true );
}

Assistant:

static const MOJOSHADER_astDataType *match_func_to_call(Context *ctx,
                                    MOJOSHADER_astExpressionCallFunction *ast)
{
    SymbolScope *best = NULL;  // best choice we find.
    int best_score = 0;
    MOJOSHADER_astExpressionIdentifier *ident = ast->identifier;
    const char *sym = ident->identifier;
    const void *value = NULL;
    void *iter = NULL;

    int argcount = 0;
    MOJOSHADER_astArguments *args = ast->args;
    while (args != NULL)
    {
        argcount++;
        type_check_ast(ctx, args->argument);
        args = args->next;
    } // while;

    // we do some tapdancing to handle function overloading here.
    int match = 0;
    while (hash_iter(ctx->variables.hash, sym, &value, &iter))
    {
        SymbolScope *item = (SymbolScope *) value;
        const MOJOSHADER_astDataType *dt = item->datatype;
        dt = reduce_datatype(ctx, dt);
        // there's a locally-scoped symbol with this name? It takes precedence.
        if (dt->type != MOJOSHADER_AST_DATATYPE_FUNCTION)
            return dt;

        const MOJOSHADER_astDataTypeFunction *dtfn = (MOJOSHADER_astDataTypeFunction *) dt;
        const int perfect = argcount * ((int) DT_MATCH_PERFECT);
        int score = 0;

        if (argcount == dtfn->num_params)  // !!! FIXME: default args.
        {
            args = ast->args;
            int i;
            for (i = 0; i < argcount; i++)
            {
                assert(args != NULL);
                dt = args->argument->datatype;
                args = args->next;
                const DatatypeMatch compatible = compatible_arg_datatype(ctx, dt, dtfn->params[i]);
                if (compatible == DT_MATCH_INCOMPATIBLE)
                {
                    args = NULL;
                    score = 0;
                    break;
                } // if

                score += (int) compatible;
            } // for

            if (args != NULL)
                score = 0;  // too many arguments supplied. No match.
        } // else

        if (score == 0)  // incompatible.
            continue;

        else if (score == perfect)  // perfection! stop looking!
        {
            match = 1;  // ignore all other compatible matches.
            best = item;
            break;
        } // if

        else if (score >= best_score)  // compatible, but not perfect, match.
        {
            if (score == best_score)
            {
                match++;
                // !!! FIXME: list each possible function in a fail(),
                // !!! FIXME:  but you can't actually fail() here, since
                // !!! FIXME:  this may cease to be ambiguous if we get
                // !!! FIXME:  a better match on a later overload.
            } // if

            else if (score > best_score)
            {
                match = 1;  // reset the ambiguousness count.
                best = item;
                best_score = score;
            } // if
        } // else if
    } // while

    if (match > 1)
    {
        assert(best != NULL);
        failf(ctx, "Ambiguous function call to '%s'", sym);
    } // if

    if (best == NULL)
    {
        assert(match == 0);
        assert(best_score == 0);
        // !!! FIXME: ident->datatype = ?
        failf(ctx, "No matching function named '%s'", sym);
    } // if
    else
    {
        ident->datatype = reduce_datatype(ctx, best->datatype);
        ident->index = best->index;
    } // else

    return ident->datatype;
}